

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::Element(cmXMLWriter *this,char *name)

{
  ostream *poVar1;
  char *name_local;
  cmXMLWriter *this_local;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)((this->IsContent ^ 0xffU) & 1));
  poVar1 = std::operator<<(this->Output,'<');
  poVar1 = std::operator<<(poVar1,name);
  std::operator<<(poVar1,"/>");
  return;
}

Assistant:

void cmXMLWriter::Element(const char* name)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << '<' << name << "/>";
}